

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Gc::Gc(Gc *this)

{
  Mapping *in_RDI;
  size_t unaff_retaddr;
  Gc *in_stack_000000f0;
  undefined8 in_stack_ffffffffffffffb8;
  int fd;
  Mapping *hash;
  HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
  *this_00;
  Mapping *in_stack_ffffffffffffffe8;
  
  hash = in_RDI;
  axl::io::psx::Mapping::Mapping(in_RDI);
  this_00 = (HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
             *)(hash + 1);
  axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::Array
            ((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)0x120133);
  fd = (int)((ulong)&in_RDI[2].m_size >> 0x20);
  axl::sl::
  HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
  ::HashTable(this_00,(HashId<unsigned_long> *)hash,(Eq<unsigned_long,_unsigned_long> *)in_RDI);
  axl::sys::psx::Sem::Sem
            ((Sem *)(in_RDI + 7),SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0),
             (uint_t)in_stack_ffffffffffffffb8);
  axl::io::psx::Mapping::map
            (in_stack_ffffffffffffffe8,this_00,(size_t)hash,(int)((ulong)in_RDI >> 0x20),
             (uint_t)in_RDI,fd,unaff_retaddr);
  *(undefined4 *)&in_RDI[6].m_size = 0;
  installSignalHandlers(in_stack_000000f0);
  return;
}

Assistant:

Gc() {
		m_guardPage.map(
			NULL,
			4 * 1024, // typical page size -- OS will not give us less than that, anyway
			PROT_READ | PROT_WRITE,
			MAP_PRIVATE | MAP_ANON,
			-1,
			0
		);

		m_handshakeKind = HandshakeKind_None;
		installSignalHandlers();
	}